

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::javanano::(anonymous_namespace)::FieldName_abi_cxx11_
                   (FieldDescriptor *field)

{
  Type TVar1;
  
  TVar1 = FieldDescriptor::type(field);
  if (TVar1 == TYPE_GROUP) {
    field = (FieldDescriptor *)FieldDescriptor::message_type(field);
  }
  return *(string **)field;
}

Assistant:

const string& FieldName(const FieldDescriptor* field) {
  // Groups are hacky:  The name of the field is just the lower-cased name
  // of the group type.  In Java, though, we would like to retain the original
  // capitalization of the type name.
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    return field->message_type()->name();
  } else {
    return field->name();
  }
}